

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

char cppurses::key_to_char(Code key)

{
  Code CVar1;
  
  CVar1 = Null;
  if (0xffa0 < (ushort)(key - Backspace)) {
    CVar1 = key;
  }
  return (char)CVar1;
}

Assistant:

char key_to_char(Key::Code key) {
    const auto alpha_low = std::int16_t{32};
    const auto alpha_high = std::int16_t{126};
    const auto value = static_cast<std::int16_t>(key);
    if (value < alpha_low || value > alpha_high) {
        return '\0';
    }
    return static_cast<char>(value);
}